

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::CallOrCast::CallOrCast
          (CallOrCast *this,Expression *nameOrTargetType,
          pool_ptr<soul::AST::CommaSeparatedList> *args,bool isMethod)

{
  pool_ptr<soul::AST::CommaSeparatedList> local_18;
  
  local_18 = (pool_ptr<soul::AST::CommaSeparatedList>)args->object;
  CallOrCastBase::CallOrCastBase
            (&this->super_CallOrCastBase,CallOrCast,
             &(nameOrTargetType->super_Statement).super_ASTObject.context,&local_18,isMethod);
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__CallOrCast_002f78e0;
  (this->nameOrType).object = nameOrTargetType;
  return;
}

Assistant:

CallOrCast (Expression& nameOrTargetType, pool_ptr<CommaSeparatedList> args, bool isMethod)
            : CallOrCastBase (ObjectType::CallOrCast, nameOrTargetType.context, args, isMethod), nameOrType (nameOrTargetType)
        {
        }